

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O1

ExtTypeVTable * tvm::runtime::ExtTypeVTable::Get(int type_code)

{
  Manager *pMVar1;
  LogMessageFatal local_1a0;
  
  if (0x6f < type_code - 0x10U) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/registry.cc"
               ,0x75);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"Check failed: type_code > kExtBegin && type_code < kExtEnd",
               0x3a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,": ",2);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  pMVar1 = Registry::Manager::Global();
  if ((pMVar1->ext_vtable)._M_elems[type_code].destroy == (_func_void_void_ptr *)0x0) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1a0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/registry.cc"
               ,0x78);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"Check failed: vt->destroy != nullptr",0x24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a0,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a0,"Extension type not registered",0x1d);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1a0);
  }
  return (pMVar1->ext_vtable)._M_elems + type_code;
}

Assistant:

ExtTypeVTable *ExtTypeVTable::Get(int type_code) {
  CHECK(type_code > kExtBegin && type_code < kExtEnd);
  Registry::Manager *m = Registry::Manager::Global();
  ExtTypeVTable *vt = &(m->ext_vtable[type_code]);
  CHECK(vt->destroy != nullptr)
      << "Extension type not registered";
  return vt;
}